

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void FCanvasTextureInfo::Serialize(FArchive *arc)

{
  AActor *pAVar1;
  FCanvasTextureInfo **ppFVar2;
  FArchive *pFVar3;
  FCanvasTextureInfo *pFVar4;
  AActor *nullactor;
  FTextureID picnum;
  int fov;
  AActor *local_38;
  FTextureID local_30;
  DWORD local_2c;
  
  if (arc->m_Storing == true) {
    pFVar4 = List;
    if (List != (FCanvasTextureInfo *)0x0) {
      do {
        if ((pFVar4->Texture != (FCanvasTexture *)0x0) &&
           (pAVar1 = (pFVar4->Viewpoint).field_0.p, pAVar1 != (AActor *)0x0)) {
          if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            pFVar3 = FArchive::SerializeObject
                               (arc,(DObject **)&pFVar4->Viewpoint,AActor::RegistrationInfo.MyClass)
            ;
            pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)&pFVar4->FOV);
            ::operator<<(pFVar3,&pFVar4->PicNum);
          }
          else {
            (pFVar4->Viewpoint).field_0.p = (AActor *)0x0;
          }
        }
        ppFVar2 = &pFVar4->Next;
        pFVar4 = *ppFVar2;
      } while (*ppFVar2 != (FCanvasTextureInfo *)0x0);
    }
    local_38 = (AActor *)0x0;
    FArchive::SerializeObject(arc,(DObject **)&local_38,AActor::RegistrationInfo.MyClass);
  }
  else {
    EmptyList();
    FArchive::SerializeObject(arc,(DObject **)&local_38,AActor::RegistrationInfo.MyClass);
    if (local_38 != (AActor *)0x0) {
      do {
        pFVar3 = FArchive::operator<<(arc,&local_2c);
        ::operator<<(pFVar3,&local_30);
        Add(local_38,local_30,local_2c);
        FArchive::SerializeObject(arc,(DObject **)&local_38,AActor::RegistrationInfo.MyClass);
      } while (local_38 != (AActor *)0x0);
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::Serialize (FArchive &arc)
{
	if (arc.IsStoring ())
	{
		FCanvasTextureInfo *probe;

		for (probe = List; probe != NULL; probe = probe->Next)
		{
			if (probe->Texture != NULL && probe->Viewpoint != NULL)
			{
				arc << probe->Viewpoint << probe->FOV << probe->PicNum;
			}
		}
		AActor *nullactor = NULL;
		arc << nullactor;
	}
	else
	{
		AActor *viewpoint;
		int fov;
		FTextureID picnum;
		
		EmptyList ();
		while (arc << viewpoint, viewpoint != NULL)
		{
			arc << fov << picnum;
			Add (viewpoint, picnum, fov);
		}
	}
}